

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.h
# Opt level: O1

bool __thiscall
Js::PropertyRecordUsageCache::TrySetPropertyFromCache<false>
          (PropertyRecordUsageCache *this,RecyclableObject *object,Var propertyValue,
          ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags,
          PropertyValueInfo *propertyValueInfo,RecyclableObject *owner,
          PropertyCacheOperationInfo *operationInfo)

{
  PropertyRecord *pPVar1;
  Type *pTVar2;
  bool bVar3;
  bool bVar4;
  PolymorphicInlineCache *pPVar5;
  
  bVar3 = ShouldUseCache(this);
  if (bVar3) {
    pPVar5 = GetStElemInlineCache(this);
    PropertyValueInfo::SetCacheInfo(propertyValueInfo,owner,this,pPVar5,true);
    bVar3 = CacheOperators::TrySetProperty<true,true,true,true,true,false,true,false>
                      (object,false,((this->propertyRecord).ptr)->pid,propertyValue,requestContext,
                       propertyOperationFlags,operationInfo,propertyValueInfo);
    if (bVar3) {
      bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,PropertyCachePhase);
      if (bVar4) {
        Output::Print(L"PropertyCache: SetElem cache hit for \'%s\': type %p\n",
                      (this->propertyRecord).ptr + 1,(object->type).ptr);
      }
      this->hitRate = this->hitRate + 1;
      if (bVar3) {
        return true;
      }
    }
  }
  RegisterCacheMiss(this);
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015cd718,PropertyCachePhase);
  if (bVar3) {
    pPVar1 = (this->propertyRecord).ptr;
    pTVar2 = (object->type).ptr;
    pPVar5 = GetStElemInlineCache(this);
    Output::Print(L"PropertyCache: SetElem cache miss for \'%s\': type %p, index %d\n",pPVar1 + 1,
                  pTVar2,(ulong)((uint)((ulong)(object->type).ptr >> 6) & pPVar5->size - 1));
    DumpCache(this,false);
  }
  return false;
}

Assistant:

inline bool PropertyRecordUsageCache::TrySetPropertyFromCache(
        _In_ RecyclableObject *const object,
        _In_ Var propertyValue,
        _In_ ScriptContext *const requestContext,
        const PropertyOperationFlags propertyOperationFlags,
        _Out_ PropertyValueInfo *const propertyValueInfo,
        _In_ RecyclableObject *const owner, // Object that this usage cache is part of
        _Out_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        if (ShouldUseCache())
        {
            PropertyValueInfo::SetCacheInfo(propertyValueInfo, owner, this, GetStElemInlineCache(), true /* allowResizing */);
            bool found = CacheOperators::TrySetProperty<
                true,   // CheckLocal
                true,   // CheckLocalTypeWithoutProperty
                true,   // CheckAccessor
                true,   // CheckPolymorphicInlineCache
                true,   // CheckTypePropertyCache
                false,  // IsInlineCacheAvailable
                true,   // IsPolymorphicInlineCacheAvailable
                ReturnOperationInfo>
                (object,
                    false, // isRoot
                    this->propertyRecord->GetPropertyId(),
                    propertyValue,
                    requestContext,
                    propertyOperationFlags,
                    operationInfo,
                    propertyValueInfo);

            if (found)
            {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (PHASE_TRACE1(PropertyCachePhase))
                {
                    Output::Print(_u("PropertyCache: SetElem cache hit for '%s': type %p\n"), GetString(), object->GetType());
                }
#endif
                RegisterCacheHit();
                return true;
            }
        }
        RegisterCacheMiss();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE1(PropertyCachePhase))
        {
            Output::Print(_u("PropertyCache: SetElem cache miss for '%s': type %p, index %d\n"),
                GetString(),
                object->GetType(),
                GetStElemInlineCache()->GetInlineCacheIndexForType(object->GetType()));
            DumpCache(false);
        }
#endif
        return false;
    }